

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O1

void cos1D_predict<IMLE<1,1,FastLinearExpert>>(IMLE<1,_1,_FastLinearExpert> *imleObj)

{
  pointer pdVar1;
  pointer pdVar2;
  X *pXVar3;
  ostream *poVar4;
  ulong uVar5;
  undefined8 *puVar6;
  value_type_conflict *__x;
  uint uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  result_type_conflict1 rVar11;
  double dVar12;
  uniform_01<double,_double> uniform;
  SrcEvaluatorType srcEvaluator;
  SrcEvaluatorType srcEvaluator_1;
  vector<double,_std::allocator<double>_> invSol;
  mt19937 rng;
  new_uniform_01<double> local_a39;
  double *local_a38;
  double *local_a30;
  vector<double,_std::allocator<double>_> local_a28;
  double local_a10;
  ulong local_a08;
  pointer local_a00;
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  local_9f8;
  
  boost::random::
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  ::seed(&local_9f8,
         &boost::random::
          mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>
          ::default_seed);
  local_a38 = (double *)malloc(8);
  if (local_a38 == (double *)0x0) {
    puVar6 = (undefined8 *)__cxa_allocate_exception();
    *puVar6 = operator_delete;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_a30 = (double *)malloc(8);
  if (local_a30 != (double *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\t --- Forward Prediction (random input locations): ---",0x36)
    ;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    iVar9 = 10;
    do {
      rVar11 = boost::random::detail::new_uniform_01<double>::operator()(&local_a39,&local_9f8);
      local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(rVar11 * 4.0 * 3.141592653589793);
      *local_a38 = (double)local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
      pXVar3 = IMLE<1,_1,_FastLinearExpert>::predict(imleObj,(Z *)&local_a28);
      *local_a30 = (pXVar3->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.
                   m_data.array[0];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t cos(",6);
      poVar4 = std::ostream::_M_insert<double>(*local_a38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") = ",4);
      dVar12 = cos(*local_a38);
      poVar4 = std::ostream::_M_insert<double>(dVar12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tpred(",6);
      poVar4 = std::ostream::_M_insert<double>(*local_a38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") = ",4);
      poVar4 = std::ostream::_M_insert<double>(*local_a30);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  (error = ",0xb);
      dVar12 = cos(*local_a38);
      poVar4 = std::ostream::_M_insert<double>(dVar12 - *local_a30);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\t\t    Jacobian(",0xf);
      poVar4 = std::ostream::_M_insert<double>(*local_a38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") = ",4);
      dVar12 = sin(*local_a38);
      poVar4 = std::ostream::_M_insert<double>(-dVar12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\t\tpredJacobian(",0xf);
      poVar4 = std::ostream::_M_insert<double>(*local_a38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") = ",4);
      IMLE<1,_1,_FastLinearExpert>::getMultiplePredictionsJacobian(imleObj);
      poVar4 = std::ostream::_M_insert<double>
                         ((double)(imleObj->predictionsJacobian).
                                  super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                                  .
                                  super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[imleObj->solIdx].
                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                                  m_storage);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\t --- Inverse Prediction (random output locations): ---",0x37
              );
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    uVar5 = 0;
    do {
      local_a08 = uVar5;
      rVar11 = boost::random::detail::new_uniform_01<double>::operator()(&local_a39,&local_9f8);
      local_a00 = (pointer)(rVar11 + rVar11 + -1.0);
      *local_a30 = (double)local_a00;
      local_a10 = acos((double)local_a00);
      local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = local_a00;
      IMLE<1,_1,_FastLinearExpert>::predictInverse(imleObj,(X *)&local_a28);
      local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (double *)0x0;
      local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (double *)0x0;
      local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (double *)0x0;
      iVar9 = imleObj->nInvSolFound;
      lVar8 = (long)iVar9;
      if (0 < lVar8) {
        lVar10 = 0;
        do {
          __x = (value_type_conflict *)
                ((long)&(((imleObj->invPredictions).
                          super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                          .
                          super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage +
                lVar10);
          if (local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert
                      (&local_a28,
                       (iterator)
                       local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,__x);
          }
          else {
            *local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish = *__x;
            local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          lVar10 = lVar10 + 8;
        } while (lVar8 * 8 - lVar10 != 0);
      }
      pdVar2 = local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar1 = local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar5 = (long)local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        lVar10 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar10 == 0; lVar10 = lVar10 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pdVar1,pdVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tinvCos(",8);
      poVar4 = std::ostream::_M_insert<double>(*local_a30);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") = ( ",6);
      poVar4 = std::ostream::_M_insert<double>(local_a10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      poVar4 = std::ostream::_M_insert<double>(6.283185307179586 - local_a10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      poVar4 = std::ostream::_M_insert<double>(local_a10 + 6.283185307179586);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      poVar4 = std::ostream::_M_insert<double>(12.566370614359172 - local_a10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," )",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t  pred(",8);
      poVar4 = std::ostream::_M_insert<double>(*local_a30);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") = ( ",6);
      if (0 < iVar9) {
        lVar10 = 0;
        do {
          poVar4 = std::ostream::_M_insert<double>
                             (local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar10]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
          lVar10 = lVar10 + 1;
        } while (lVar8 != lVar10);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
      std::ostream::put('\x18');
      std::ostream::flush();
      uVar5 = local_a08;
      if (local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_a28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar7 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar7;
    } while (uVar7 != 10);
    free(local_a30);
    free(local_a38);
    return;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = operator_delete;
  __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void cos1D_predict( Learner &imleObj)
{
    // Random number generation
    boost::mt19937 rng;
    boost::uniform_01<Scal> uniform;
    // Query dataset size
    const int NPOINTS_QUERY = 10;
    // Input and output Eigen vectors
    Vec z(1), x(1);

    // Forward Prediction
    cout << "\t --- Forward Prediction (random input locations): ---" << endl;
    for(int k = 0; k < NPOINTS_QUERY; k++)
    {
        z[0] = uniform(rng) * 4*M_PI;

        x = imleObj.predict(z);
        // Alternatively:
        //      imleObj.predict();
        //      x = getPrediction()[0];

        cout << "\t cos(" << z[0] << ") = " << cos(z[0]) << endl;
        cout << "\tpred(" << z[0] << ") = " << x[0] << "  (error = " << cos(z[0])-x[0] << ")" << endl;
        cout << "\t\t    Jacobian(" << z[0] << ") = " << -sin(z[0]) << endl;
        cout << "\t\tpredJacobian(" << z[0] << ") = " << imleObj.getPredictionJacobian()(0,0) << endl;
    }

    // Inverse Prediction
    cout << "\t --- Inverse Prediction (random output locations): ---" << endl;
    for(int k = 0; k < NPOINTS_QUERY; k++)
    {
        x[0] = uniform(rng) * 2.0 - 1.0;
        Scal inv_x = acos(x[0]);

        imleObj.predictInverse(x);

        vector<Scal> invSol;
        int nSol = imleObj.getNumberOfInverseSolutionsFound();
        for( int k = 0; k < nSol; k++ )
            invSol.push_back( imleObj.getInversePredictions()[k][0] );
        sort(invSol.begin(), invSol.end() );

        cout << "\tinvCos(" << x[0] << ") = ( " << inv_x << ", " << 2.0*M_PI-inv_x << ", " << 2.0*M_PI+inv_x << ", " << 4.0*M_PI-inv_x << " )" << endl;
        cout << "\t  pred(" << x[0] << ") = ( ";
        for( int k = 0; k < nSol; k++ )
            cout << invSol[k] << ", ";
        cout << ")" << endl;
    }
}